

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void server::listdemos(int cn)

{
  ENetPacket *packet;
  int i;
  long lVar1;
  long lVar2;
  packetbuf p;
  
  packetbuf::packetbuf(&p,5000,1);
  putint(&p,0x48);
  putint(&p,DAT_00191d34);
  lVar2 = 0;
  for (lVar1 = 0; lVar1 < DAT_00191d34; lVar1 = lVar1 + 1) {
    sendstring((char *)(demos + lVar2),&p);
    lVar2 = lVar2 + 0x118;
  }
  packet = packetbuf::finalize(&p);
  sendpacket(cn,1,packet,-1);
  packetbuf::~packetbuf(&p);
  return;
}

Assistant:

void listdemos(int cn)
    {
        packetbuf p(MAXTRANS, ENET_PACKET_FLAG_RELIABLE);
        putint(p, N_SENDDEMOLIST);
        putint(p, demos.length());
        loopv(demos) sendstring(demos[i].info, p);
        sendpacket(cn, 1, p.finalize());
    }